

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionUtils.cpp
# Opt level: O2

double DIS::ConversionUtils::getPitchFromEuler(double lat,double lon,double psi,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = sin(lat);
  dVar2 = sin(lon);
  dVar3 = cos(lon);
  dVar4 = cos(lat);
  dVar5 = cos(theta);
  dVar6 = cos(psi);
  dVar7 = sin(psi);
  dVar8 = sin(theta);
  dVar1 = asin((dVar3 * dVar4 * dVar5 * dVar6 + dVar4 * dVar2 * dVar5 * dVar7) - dVar8 * dVar1);
  return dVar1 * 57.29577951308238;
}

Assistant:

double ConversionUtils::getPitchFromEuler(double lat, double lon, double psi, double theta)
{
    double sinlat = sin(lat);
    double sinlon = sin(lon);
    double coslon = cos(lon);
    double coslat = cos(lat);
    double cosLatCosLon = coslat * coslon;
    double cosLatSinLon = coslat * sinlon;

    double cosTheta = cos(theta);
    double cosPsi = cos(psi);
    double sinPsi = sin(psi);
    double sinTheta = sin(theta);

    return radToDeg(asin(cosLatCosLon * cosTheta * cosPsi + cosLatSinLon * cosTheta * sinPsi
                         - sinlat * sinTheta));
}